

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int validate_length_range
              (uint8_t kind,uint64_t unum,int64_t snum,int64_t fnum,uint8_t fnum_dig,lys_type *type,
              char *val_str,lyd_node *node)

{
  ly_ctx *ctx;
  lys_restr *plVar1;
  bool bVar2;
  bool bVar3;
  lys_type *plVar4;
  int iVar5;
  lys_type *plVar6;
  uint uVar7;
  undefined7 in_register_00000039;
  char *pcVar8;
  undefined8 uVar9;
  len_ran_intv *plVar10;
  uint uVar11;
  len_ran_intv *local_50;
  len_ran_intv *intv;
  ulong local_40;
  uint local_38;
  uint local_34;
  
  local_50 = (len_ran_intv *)0x0;
  ctx = type->parent->module->ctx;
  iVar5 = resolve_len_ran_interval(ctx,(char *)0x0,type,&local_50);
  if (iVar5 == 0) {
    uVar11 = (uint)CONCAT71(in_register_00000039,kind);
    if (local_50 == (len_ran_intv *)0x0) {
      return 0;
    }
    uVar7 = uVar11 & 0xff;
    plVar4 = local_50->type;
    plVar10 = local_50;
    intv = (len_ran_intv *)snum;
    local_40 = unum;
    local_38 = uVar7;
    local_34 = uVar11;
    do {
      plVar6 = plVar4;
      bVar2 = false;
      while( true ) {
        if (plVar10 == (len_ran_intv *)0x0) {
          bVar2 = !bVar2;
          goto LAB_001244e9;
        }
        if (plVar10->type != plVar6) break;
        bVar3 = !bVar2;
        bVar2 = true;
        if (bVar3) {
          bVar2 = false;
          if ((char)uVar11 == '\x02') {
            iVar5 = dec64cmp(fnum,fnum_dig,(plVar10->value).sval.min,(plVar6->info).dec64.dig);
            if (iVar5 < 0) goto LAB_001244da;
            iVar5 = dec64cmp(fnum,fnum_dig,(plVar10->value).sval.min,(plVar6->info).dec64.dig);
            snum = (int64_t)intv;
            unum = local_40;
            uVar11 = local_34;
            uVar7 = local_38;
            if ((-1 < iVar5) &&
               (iVar5 = dec64cmp(fnum,fnum_dig,(plVar10->value).sval.max,(plVar6->info).dec64.dig),
               snum = (int64_t)intv, unum = local_40, uVar11 = local_34, uVar7 = local_38, iVar5 < 1
               )) {
LAB_001244b2:
              bVar2 = true;
            }
          }
          else if (uVar7 == 1) {
            if (snum < (plVar10->value).sval.min) goto LAB_001244da;
            if (snum <= (plVar10->value).sval.max) goto LAB_001244b2;
          }
          else {
            bVar2 = false;
            if (uVar7 == 0) {
              if (unum < (plVar10->value).uval.min) goto LAB_001244da;
              if (unum <= (plVar10->value).uval.max) goto LAB_001244b2;
            }
          }
        }
        plVar10 = plVar10->next;
      }
      plVar4 = plVar10->type;
    } while (bVar2);
LAB_001244da:
    bVar2 = true;
LAB_001244e9:
    while (local_50 != (len_ran_intv *)0x0) {
      plVar10 = local_50->next;
      free(local_50);
      local_50 = plVar10;
    }
    if (!bVar2) {
      return 0;
    }
    if ((plVar6->base < LY_TYPE_UNKNOWN) &&
       ((0xff412U >> (plVar6->base & (LY_TYPE_INT32|LY_TYPE_UINT16)) & 1) != 0)) {
      plVar1 = (plVar6->info).dec64.range;
      pcVar8 = "";
      if (val_str != (char *)0x0) {
        pcVar8 = val_str;
      }
      if (plVar1 == (lys_restr *)0x0) {
        ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar8,"");
        return 1;
      }
      ly_vlog(ctx,LYE_NOCONSTR,LY_VLOG_LYD,node,pcVar8,plVar1->expr);
      if (plVar1->emsg != (char *)0x0) {
        ly_vlog_str(ctx,LY_VLOG_PREV,plVar1->emsg);
      }
      if (plVar1->eapptag != (char *)0x0) {
        ly_err_last_set_apptag(ctx,plVar1->eapptag);
        return 1;
      }
      return 1;
    }
    uVar9 = 0x249;
  }
  else {
    uVar9 = 0x206;
  }
  ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
         "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
         ,uVar9);
  return 1;
}

Assistant:

static int
validate_length_range(uint8_t kind, uint64_t unum, int64_t snum, int64_t fnum, uint8_t fnum_dig, struct lys_type *type,
                      const char *val_str, struct lyd_node *node)
{
    struct lys_restr *restr = NULL;
    struct len_ran_intv *intv = NULL, *tmp_intv;
    struct lys_type *cur_type;
    struct ly_ctx *ctx = type->parent->module->ctx;
    int match;

    if (resolve_len_ran_interval(ctx, NULL, type, &intv)) {
        /* already done during schema parsing */
        LOGINT(ctx);
        return EXIT_FAILURE;
    }
    if (!intv) {
        return EXIT_SUCCESS;
    }

    /* I know that all intervals belonging to a single restriction share one type pointer */
    tmp_intv = intv;
    cur_type = intv->type;
    do {
        match = 0;
        for (; tmp_intv && (tmp_intv->type == cur_type); tmp_intv = tmp_intv->next) {
            if (match) {
                /* just iterate through the rest of this restriction intervals */
                continue;
            }

            if (((kind == 0) && (unum < tmp_intv->value.uval.min))
                    || ((kind == 1) && (snum < tmp_intv->value.sval.min))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) < 0))) {
                break;
            }

            if (((kind == 0) && (unum >= tmp_intv->value.uval.min) && (unum <= tmp_intv->value.uval.max))
                    || ((kind == 1) && (snum >= tmp_intv->value.sval.min) && (snum <= tmp_intv->value.sval.max))
                    || ((kind == 2) && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.min, cur_type->info.dec64.dig) > -1)
                    && (dec64cmp(fnum, fnum_dig, tmp_intv->value.fval.max, cur_type->info.dec64.dig) < 1))) {
                match = 1;
            }
        }

        if (!match) {
            break;
        } else if (tmp_intv) {
            cur_type = tmp_intv->type;
        }
    } while (tmp_intv);

    while (intv) {
        tmp_intv = intv->next;
        free(intv);
        intv = tmp_intv;
    }

    if (!match) {
        switch (cur_type->base) {
        case LY_TYPE_BINARY:
            restr = cur_type->info.binary.length;
            break;
        case LY_TYPE_DEC64:
            restr = cur_type->info.dec64.range;
            break;
        case LY_TYPE_INT8:
        case LY_TYPE_INT16:
        case LY_TYPE_INT32:
        case LY_TYPE_INT64:
        case LY_TYPE_UINT8:
        case LY_TYPE_UINT16:
        case LY_TYPE_UINT32:
        case LY_TYPE_UINT64:
            restr = cur_type->info.num.range;
            break;
        case LY_TYPE_STRING:
            restr = cur_type->info.str.length;
            break;
        default:
            LOGINT(ctx);
            return EXIT_FAILURE;
        }

        LOGVAL(ctx, LYE_NOCONSTR, LY_VLOG_LYD, node, (val_str ? val_str : ""), restr ? restr->expr : "");
        if (restr && restr->emsg) {
            ly_vlog_str(ctx, LY_VLOG_PREV, restr->emsg);
        }
        if (restr && restr->eapptag) {
            ly_err_last_set_apptag(ctx, restr->eapptag);
        }
        return EXIT_FAILURE;
    }
    return EXIT_SUCCESS;
}